

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ValidateProto3Extension_Test::TestBody
          (ValidationErrorTest_ValidateProto3Extension_Test *this)

{
  bool bVar1;
  Descriptor *this_00;
  FileDescriptor *pFVar2;
  char *pcVar3;
  uint32_t *puVar4;
  Arena *pAVar5;
  char *in_R9;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_578;
  allocator<char> local_559;
  string local_558;
  string_view local_538;
  string local_528;
  AssertHelper local_508;
  Message local_500;
  bool local_4f1;
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar__1;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  allocator<char> local_439;
  string local_438;
  allocator<char> local_411;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  uint local_20c;
  string local_208;
  AssertHelper local_1e8;
  Message local_1e0;
  bool local_1d1;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_;
  undefined1 local_1b0 [8];
  FileDescriptorProto file_proto;
  DescriptorPool pool;
  ValidationErrorTest_ValidateProto3Extension_Test *this_local;
  
  DescriptorPool::DescriptorPool((DescriptorPool *)((long)&file_proto.field_0 + 0xe0));
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_1b0);
  this_00 = FileDescriptorProto::descriptor();
  pFVar2 = Descriptor::file(this_00);
  FileDescriptor::CopyTo(pFVar2,(FileDescriptorProto *)local_1b0);
  pFVar2 = DescriptorPool::BuildFile
                     ((DescriptorPool *)((long)&file_proto.field_0 + 0xe0),
                      (FileDescriptorProto *)local_1b0);
  local_1d1 = pFVar2 != (FileDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d0,&local_1d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_208,(internal *)local_1d0,
               (AssertionResult *)"pool.BuildFile(file_proto) != nullptr","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1ee2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    testing::Message::~Message(&local_1e0);
  }
  local_20c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  if (local_20c == 0) {
    FileDescriptorProto::Clear((FileDescriptorProto *)local_1b0);
    puVar4 = internal::HasBits<1>::operator[]
                       ((HasBits<1> *)
                        &file_proto.super_Message.super_MessageLite._internal_metadata_,0);
    *(byte *)puVar4 = (byte)*puVar4 | 1;
    pAVar5 = protobuf::MessageLite::GetArena((MessageLite *)local_1b0);
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)
               &file_proto.field_0._impl_.option_dependency_.super_RepeatedPtrFieldBase.arena_,
               "foo.proto",pAVar5);
    puVar4 = internal::HasBits<1>::operator[]
                       ((HasBits<1> *)
                        &file_proto.super_Message.super_MessageLite._internal_metadata_,0);
    *(byte *)puVar4 = (byte)*puVar4 | 4;
    pAVar5 = protobuf::MessageLite::GetArena((MessageLite *)local_1b0);
    internal::ArenaStringPtr::Set(&file_proto.field_0._impl_.package_,"proto3",pAVar5);
    FileDescriptorProto::add_dependency<char_const(&)[33]>
              ((FileDescriptorProto *)local_1b0,(char (*) [33])0x1e1c615);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"google.protobuf.FileOptions",&local_231);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"test_file_opt",&local_259);
    AddExtension((FileDescriptorProto *)local_1b0,&local_230,&local_258,0x3e9,
                 FieldDescriptorProto_Label_LABEL_OPTIONAL,FieldDescriptorProto_Type_TYPE_STRING);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator(&local_259);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator(&local_231);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"google.protobuf.MessageOptions",&local_281);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"test_msg_opt",&local_2a9);
    AddExtension((FileDescriptorProto *)local_1b0,&local_280,&local_2a8,0x3e9,
                 FieldDescriptorProto_Label_LABEL_OPTIONAL,FieldDescriptorProto_Type_TYPE_STRING);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"google.protobuf.FieldOptions",&local_2d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,"test_field_opt",&local_2f9);
    AddExtension((FileDescriptorProto *)local_1b0,&local_2d0,&local_2f8,0x3eb,
                 FieldDescriptorProto_Label_LABEL_OPTIONAL,FieldDescriptorProto_Type_TYPE_STRING);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator(&local_2f9);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"google.protobuf.EnumOptions",&local_321);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,"test_enum_opt",&local_349);
    AddExtension((FileDescriptorProto *)local_1b0,&local_320,&local_348,0x3ec,
                 FieldDescriptorProto_Label_LABEL_REPEATED,FieldDescriptorProto_Type_TYPE_INT32);
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator(&local_349);
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator(&local_321);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,"google.protobuf.EnumValueOptions",&local_371);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,"test_enumval_opt",&local_399);
    AddExtension((FileDescriptorProto *)local_1b0,&local_370,&local_398,0x3ed,
                 FieldDescriptorProto_Label_LABEL_OPTIONAL,FieldDescriptorProto_Type_TYPE_INT32);
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator(&local_399);
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator(&local_371);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"google.protobuf.ServiceOptions",&local_3c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e8,"test_svc_opt",&local_3e9);
    AddExtension((FileDescriptorProto *)local_1b0,&local_3c0,&local_3e8,0x3ee,
                 FieldDescriptorProto_Label_LABEL_REPEATED,FieldDescriptorProto_Type_TYPE_INT32);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator(&local_3e9);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::allocator<char>::~allocator(&local_3c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_410,"google.protobuf.MethodOptions",&local_411);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_438,"test_method_opt",&local_439);
    AddExtension((FileDescriptorProto *)local_1b0,&local_410,&local_438,0x3ef,
                 FieldDescriptorProto_Label_LABEL_OPTIONAL,FieldDescriptorProto_Type_TYPE_STRING);
    std::__cxx11::string::~string((string *)&local_438);
    std::allocator<char>::~allocator(&local_439);
    std::__cxx11::string::~string((string *)&local_410);
    std::allocator<char>::~allocator(&local_411);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,"google.protobuf.OneofOptions",&local_461);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_488,"test_oneof_opt",&local_489);
    AddExtension((FileDescriptorProto *)local_1b0,&local_460,&local_488,0x3f0,
                 FieldDescriptorProto_Label_LABEL_OPTIONAL,FieldDescriptorProto_Type_TYPE_STRING);
    std::__cxx11::string::~string((string *)&local_488);
    std::allocator<char>::~allocator(&local_489);
    std::__cxx11::string::~string((string *)&local_460);
    std::allocator<char>::~allocator(&local_461);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b0,"google.protobuf.ExtensionRangeOptions",&local_4b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d8,"test_ext_opt",
               (allocator<char> *)
               ((long)&gtest_ar__1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    pcVar3 = (char *)0x9;
    AddExtension((FileDescriptorProto *)local_1b0,&local_4b0,&local_4d8,0x3f1,
                 FieldDescriptorProto_Label_LABEL_OPTIONAL,FieldDescriptorProto_Type_TYPE_STRING);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&gtest_ar__1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    std::__cxx11::string::~string((string *)&local_4b0);
    std::allocator<char>::~allocator(&local_4b1);
    pFVar2 = DescriptorPool::BuildFile
                       ((DescriptorPool *)((long)&file_proto.field_0 + 0xe0),
                        (FileDescriptorProto *)local_1b0);
    local_4f1 = pFVar2 != (FileDescriptor *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_4f0,&local_4f1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f0);
    if (!bVar1) {
      testing::Message::Message(&local_500);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_528,(internal *)local_4f0,
                 (AssertionResult *)"pool.BuildFile(file_proto) != nullptr","false","true",pcVar3);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_508,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x1f1f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_508,&local_500);
      testing::internal::AssertHelper::~AssertHelper(&local_508);
      std::__cxx11::string::~string((string *)&local_528);
      testing::Message::~Message(&local_500);
    }
    local_20c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f0);
    if (local_20c == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_538,
                 "name: \'google.protobuf.proto\' syntax: \'proto2\' message_type {   name: \'Container\' extension_range { start: 1 end: 1000 } }"
                );
      ValidationErrorTest::BuildFile(&this->super_ValidationErrorTest,local_538);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_558,
                 "name: \'bar.proto\' syntax: \'proto3\' dependency: \'google.protobuf.proto\' extension {   name: \'bar\' number: 1 label: LABEL_OPTIONAL type: TYPE_INT32   extendee: \'Container\' }"
                 ,&local_559);
      testing::
      Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Matcher(&local_578,
              "bar.proto: bar: EXTENDEE: Extensions in proto3 are only allowed for defining options.\n"
             );
      ValidationErrorTest::BuildFileWithErrors
                (&this->super_ValidationErrorTest,&local_558,&local_578);
      testing::
      Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~Matcher(&local_578);
      std::__cxx11::string::~string((string *)&local_558);
      std::allocator<char>::~allocator(&local_559);
      local_20c = 0;
    }
  }
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_1b0);
  DescriptorPool::~DescriptorPool((DescriptorPool *)((long)&file_proto.field_0 + 0xe0));
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ValidateProto3Extension) {
  // Valid for options.
  DescriptorPool pool;
  FileDescriptorProto file_proto;
  // Add "google/protobuf/descriptor.proto".
  FileDescriptorProto::descriptor()->file()->CopyTo(&file_proto);
  ASSERT_TRUE(pool.BuildFile(file_proto) != nullptr);
  // Add "foo.proto":
  //   import "google/protobuf/descriptor.proto";
  //   extend google.protobuf.FileOptions {
  //     optional string test_file_opt = 1001;
  //   }
  //   extend google.protobuf.MessageOptions {
  //     optional string test_msg_opt = 1002;
  //   }
  //   extend google.protobuf.FieldOptions {
  //     optional string test_field_opt = 1003;
  //   }
  //   extend google.protobuf.EnumOptions {
  //     repeated int32 test_enum_opt = 1004;
  //   }
  //   extend google.protobuf.EnumValueOptions {
  //     optional int32 test_enumval_opt = 1005;
  //   }
  //   extend google.protobuf.ServiceOptions {
  //     repeated int32 test_svc_opt = 1006;
  //   }
  //   extend google.protobuf.MethodOptions {
  //     optional string test_method_opt = 1007;
  //   }
  //   extend google.protobuf.OneofOptions {
  //     optional string test_oneof_opt = 1008;
  //   }
  //   extend google.protobuf.ExtensionRangeOptions {
  //     optional string test_ext_opt = 1009;
  //   }
  file_proto.Clear();
  file_proto.set_name("foo.proto");
  file_proto.set_syntax("proto3");
  file_proto.add_dependency("google/protobuf/descriptor.proto");
  AddExtension(&file_proto, "google.protobuf.FileOptions", "test_file_opt", 1001,
               FieldDescriptorProto::LABEL_OPTIONAL,
               FieldDescriptorProto::TYPE_STRING);
  AddExtension(&file_proto, "google.protobuf.MessageOptions", "test_msg_opt", 1001,
               FieldDescriptorProto::LABEL_OPTIONAL,
               FieldDescriptorProto::TYPE_STRING);
  AddExtension(&file_proto, "google.protobuf.FieldOptions", "test_field_opt", 1003,
               FieldDescriptorProto::LABEL_OPTIONAL,
               FieldDescriptorProto::TYPE_STRING);
  AddExtension(&file_proto, "google.protobuf.EnumOptions", "test_enum_opt", 1004,
               FieldDescriptorProto::LABEL_REPEATED,
               FieldDescriptorProto::TYPE_INT32);
  AddExtension(&file_proto, "google.protobuf.EnumValueOptions", "test_enumval_opt", 1005,
               FieldDescriptorProto::LABEL_OPTIONAL,
               FieldDescriptorProto::TYPE_INT32);
  AddExtension(&file_proto, "google.protobuf.ServiceOptions", "test_svc_opt", 1006,
               FieldDescriptorProto::LABEL_REPEATED,
               FieldDescriptorProto::TYPE_INT32);
  AddExtension(&file_proto, "google.protobuf.MethodOptions", "test_method_opt", 1007,
               FieldDescriptorProto::LABEL_OPTIONAL,
               FieldDescriptorProto::TYPE_STRING);
  AddExtension(&file_proto, "google.protobuf.OneofOptions", "test_oneof_opt", 1008,
               FieldDescriptorProto::LABEL_OPTIONAL,
               FieldDescriptorProto::TYPE_STRING);
  AddExtension(&file_proto, "google.protobuf.ExtensionRangeOptions", "test_ext_opt",
               1009, FieldDescriptorProto::LABEL_OPTIONAL,
               FieldDescriptorProto::TYPE_STRING);
  ASSERT_TRUE(pool.BuildFile(file_proto) != nullptr);

  // Copy and change the package of the descriptor.proto
  BuildFile(
      "name: 'google.protobuf.proto' "
      "syntax: 'proto2' "
      "message_type { "
      "  name: 'Container' extension_range { start: 1 end: 1000 } "
      "}");
  BuildFileWithErrors(
      "name: 'bar.proto' "
      "syntax: 'proto3' "
      "dependency: 'google.protobuf.proto' "
      "extension { "
      "  name: 'bar' number: 1 label: LABEL_OPTIONAL type: TYPE_INT32 "
      "  extendee: 'Container' "
      "}",
      "bar.proto: bar: EXTENDEE: Extensions in proto3 are only allowed for "
      "defining options.\n");
}